

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall FascodeUtil::msg::print(msg *this,MSG_TYPE msgtype,string *appname,string *message)

{
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string *local_28;
  string *message_local;
  string *appname_local;
  msg *pmStack_10;
  MSG_TYPE msgtype_local;
  msg *this_local;
  
  local_28 = message;
  message_local = appname;
  appname_local._4_4_ = msgtype;
  pmStack_10 = this;
  std::__cxx11::string::string((string *)&local_48,(string *)appname);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68," ",&local_69);
  std::__cxx11::string::string((string *)&local_a0,(string *)message);
  print(this,msgtype,&local_48,&local_68,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,std::string message){
        print(msgtype,appname," ",message);
    }